

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void Assimp::FBX::ResolveVertexDataArray<aiVector3t<float>>
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  pointer paVar3;
  undefined8 uVar4;
  pointer paVar5;
  float fVar6;
  Scope *pSVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Element *pEVar12;
  long lVar13;
  pointer piVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  _Alloc_hider _Var19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator local_229;
  string local_228;
  Scope *local_200;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1f8;
  vector<int,_std::allocator<int>_> local_1d8;
  char *local_1c0;
  char *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_200 = source;
  local_1b8 = dataElementName;
  iVar10 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1b0 = ReferenceInformationType;
  iVar11 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  bVar9 = true;
  bVar17 = true;
  if (iVar11 == 0) {
    std::__cxx11::string::string((string *)local_1a8,indexDataElementName,(allocator *)&local_228);
    bVar9 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    bVar17 = !bVar9;
  }
  bVar22 = iVar10 != 0 & bVar9;
  local_1c0 = indexDataElementName;
  iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar8 = local_1b8;
  if ((bVar22 == 0) && (iVar10 == 0)) {
    std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_228);
    pSVar7 = local_200;
    bVar17 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (!bVar17) {
      return;
    }
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)local_1a8,pcVar8,(allocator *)&local_1f8);
    pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228,pEVar12)
    ;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (data_out,vertex_count);
    _Var19._M_p = local_228._M_dataplus._M_p;
    if (local_228._M_string_length - (long)local_228._M_dataplus._M_p != 0) {
      lVar13 = ((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 2) *
               -0x5555555555555555;
      lVar15 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar15];
        uVar16 = (ulong)uVar2;
        uVar18 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar15] + uVar2;
        if (uVar2 < uVar18) {
          do {
            uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar16];
            paVar3 = (data_out->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar3[uVar2].z = *(float *)(local_228._M_dataplus._M_p + lVar15 * 0xc + 8);
            uVar4 = *(undefined8 *)(local_228._M_dataplus._M_p + lVar15 * 0xc);
            paVar3 = paVar3 + uVar2;
            paVar3->x = (float)(int)uVar4;
            paVar3->y = (float)(int)((ulong)uVar4 >> 0x20);
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar13 + (ulong)(lVar13 == 0));
    }
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((bool)(iVar10 != 0 | bVar17)) {
      iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
      if (bVar22 == 0 && iVar10 == 0) {
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_1f8);
        pEVar12 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_228,
                   pEVar12);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if (((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 2) *
            -0x5555555555555555 - vertex_count == 0) {
          _Var19._M_p = (pointer)(data_out->
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_dataplus._M_p;
          paVar3 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          paVar5 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._M_string_length;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.field_2._M_allocated_capacity;
          local_228._M_dataplus._M_p = _Var19._M_p;
          local_228._M_string_length = (size_type)paVar3;
          local_228.field_2._M_allocated_capacity = (size_type)paVar5;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          _Var19._M_p = local_228._M_dataplus._M_p;
        }
        goto LAB_0018b5e2;
      }
      iVar10 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((bool)(bVar17 | iVar10 != 0)) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,local_1b0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        return;
      }
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_228);
      pSVar7 = local_200;
      pEVar12 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      pcVar8 = local_1c0;
      ParseVectorDataArray(&local_1f8,pEVar12);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,pcVar8,(allocator *)&local_228);
      pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar12);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar16 = 0;
          piVar14 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar20 = (ulong)*piVar14;
            if (uVar20 == 0xffffffffffffffff) {
              paVar5 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3 = paVar5 + uVar16;
              paVar3->x = 0.0;
              paVar3->y = 0.0;
              paVar5[uVar16].z = 0.0;
            }
            else {
              uVar21 = ((long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              if (uVar21 < uVar20 || uVar21 - uVar20 == 0) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string((string *)&local_228,local_1c0,&local_229);
                pEVar12 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar12);
              }
              paVar3 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3[uVar16].z =
                   local_1f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].z;
              fVar6 = local_1f8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20].y;
              paVar3 = paVar3 + uVar16;
              paVar3->x = local_1f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].x;
              paVar3->y = fVar6;
            }
            uVar16 = (ulong)((int)uVar16 + 1);
            piVar14 = piVar14 + 1;
          } while (piVar14 !=
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x18b60a);
      }
    }
    else {
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_228);
      pSVar7 = local_200;
      pEVar12 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1f8,pEVar12);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,local_1c0,(allocator *)&local_228);
      pEVar12 = GetRequiredElement(pSVar7,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar12);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar13 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar15 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar15];
          uVar16 = (ulong)uVar2;
          uVar18 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar15] + uVar2;
          if (uVar2 < uVar18) {
            do {
              uVar20 = (ulong)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar15];
              uVar21 = ((long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              if (uVar21 < uVar20 || uVar21 - uVar20 == 0) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string((string *)&local_228,local_1c0,&local_229);
                pEVar12 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar12);
              }
              uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar16];
              paVar3 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3[uVar2].z =
                   local_1f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar20].z;
              fVar6 = local_1f8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20].y;
              paVar3 = paVar3 + uVar2;
              paVar3->x = local_1f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].x;
              paVar3->y = fVar6;
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar13 + (ulong)(lVar13 == 0));
      }
    }
    _Var19._M_p = (pointer)local_1f8.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      _Var19._M_p = (pointer)local_1f8.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
    }
  }
LAB_0018b5e2:
  if ((pointer)_Var19._M_p != (pointer)0x0) {
    operator_delete(_Var19._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}